

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadnames.cpp
# Opt level: O3

string * util::ThreadGetInternalName_abi_cxx11_(void)

{
  long lVar1;
  long lVar2;
  string *in_RDI;
  long *in_FS_OFFSET;
  
  lVar1 = in_FS_OFFSET[5];
  lVar2 = *in_FS_OFFSET;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen((char *)(lVar2 + -0x80));
  if (in_FS_OFFSET[5] == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>();
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string util::ThreadGetInternalName() { return g_thread_name; }